

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeLangevin::FluctuatingChargeLangevin
          (FluctuatingChargeLangevin *this,SimInfo *info)

{
  FluctuatingChargePropagator::FluctuatingChargePropagator
            (&this->super_FluctuatingChargePropagator,info);
  (this->super_FluctuatingChargePropagator)._vptr_FluctuatingChargePropagator =
       (_func_int **)&PTR__FluctuatingChargeLangevin_002c2f90;
  *(undefined4 *)&(this->super_FluctuatingChargePropagator).field_0x2c = 4;
  this->forceTolerance_ = 1e-06;
  this->snap_ = info->sman_->currentSnapshot_;
  std::__shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>,
             &(info->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>);
  *(undefined4 *)&(this->forceDistribution_)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->forceDistribution_)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->forceDistribution_)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->forceDistribution_)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  return;
}

Assistant:

FluctuatingChargeLangevin::FluctuatingChargeLangevin(SimInfo* info) :
      FluctuatingChargePropagator(info), maxIterNum_(4), forceTolerance_(1e-6),
      snap_(info->getSnapshotManager()->getCurrentSnapshot()),
      randNumGen_(info->getRandomNumberGenerator()) {}